

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.cpp
# Opt level: O0

void __thiscall Material::Material(Material *this)

{
  Color CVar1;
  undefined8 local_30;
  undefined8 local_28;
  undefined2 local_1f;
  uchar local_1d;
  Color local_1c [2];
  Color local_16;
  Color local_13;
  Material *pMStack_10;
  Color defColor;
  Material *this_local;
  
  pMStack_10 = this;
  Color::Color(&this->color);
  glm::tvec4<float,_(glm::precision)0>::tvec4(&this->phong);
  Color::Color(&local_13,0,0xff,0xff);
  local_16.b = local_13.b;
  local_16.r = local_13.r;
  local_16.g = local_13.g;
  local_1c[0].b = local_13.b;
  local_1c[0].r = local_13.r;
  local_1c[0].g = local_13.g;
  CVar1 = Color::operator=(&this->color,local_1c[0]);
  local_1f = CVar1._0_2_;
  local_1d = CVar1.b;
  glm::tvec4<float,(glm::precision)0>::tvec4<int,int,int,int>
            ((tvec4<float,(glm::precision)0> *)&local_30,0,0,0,1);
  *(undefined8 *)&(this->phong).field_0 = local_30;
  *(undefined8 *)((long)&(this->phong).field_0 + 8) = local_28;
  this->phongExp = 0;
  this->reflectance = 0.0;
  this->transmittance = 0.0;
  this->refraction = 0.0;
  return;
}

Assistant:

Material::Material() {
    Color defColor(0,255,255);
    color=defColor;
    this->phong={0,0,0,1};
    phongExp=0;
    reflectance=0;
    transmittance=0;
    refraction=0;
}